

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O0

void ncnn::conv3x3s1_pack8to1_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  long lVar46;
  long lVar47;
  long lVar48;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  float *pfVar49;
  long lVar50;
  long *in_RDI;
  __m128 _sum;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _sum0;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  int j;
  float *r2;
  float *r1;
  float *r0;
  int i_1;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  Mat img0;
  float *outptr0;
  int q;
  float *k0;
  float bias0;
  Mat out0;
  int p;
  int remain_outch_start;
  float *bias;
  int outch;
  int outh;
  int outw;
  int inch;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int i;
  float *ptr;
  int size;
  __m256 s0123;
  __m256 s23;
  __m256 s01;
  __m256 v3;
  __m128 x32;
  __m128 x64;
  float local_108c;
  int local_ec4;
  undefined8 *local_ec0;
  undefined8 *local_eb8;
  undefined8 *local_eb0;
  int local_ea4;
  float *local_d30;
  int local_d24;
  undefined8 *local_cd8;
  int local_c78;
  int local_c70;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  int local_3c4;
  float *local_3c0;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float local_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_230;
  float fStack_22c;
  
  lVar46 = in_RDI[7];
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar47 = in_RSI[6];
  lVar48 = in_RSI[7];
  lVar4 = *in_RCX;
  for (local_c70 = 0; local_c70 < (int)lVar48; local_c70 = local_c70 + 1) {
    iVar3 = *(int *)((long)in_RSI + 0x34);
    pfVar49 = (float *)(*in_RSI + in_RSI[8] * (long)local_c70 * in_RSI[2]);
    local_c78 = (int)(((long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] * in_RSI[2] + 0xfU
                      & 0xfffffffffffffff0) / (ulong)in_RSI[2]);
    if ((int)in_RSI[5] == 4) {
      local_c78 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
    }
    if (lVar4 == 0) {
      local_108c = 0.0;
    }
    else {
      local_108c = *(float *)(lVar4 + (long)local_c70 * 4);
    }
    local_3c0 = pfVar49;
    for (local_3c4 = 0; local_3c4 < local_c78 * iVar3; local_3c4 = local_3c4 + 1) {
      *local_3c0 = local_108c;
      local_3c0 = local_3c0 + 1;
    }
    local_cd8 = (undefined8 *)(*in_RDX + in_RDX[8] * (long)local_c70 * in_RDX[2]);
    for (local_d24 = 0; local_d24 < (int)lVar46; local_d24 = local_d24 + 1) {
      iVar3 = *(int *)((long)in_RDI + 0x2c);
      lVar50 = *in_RDI + in_RDI[8] * (long)local_d24 * in_RDI[2];
      lVar5 = in_RDI[2];
      uVar10 = *local_cd8;
      uVar11 = local_cd8[1];
      uVar12 = local_cd8[2];
      uVar13 = local_cd8[3];
      uVar14 = local_cd8[4];
      uVar15 = local_cd8[5];
      uVar16 = local_cd8[6];
      uVar17 = local_cd8[7];
      uVar18 = local_cd8[8];
      uVar19 = local_cd8[9];
      uVar20 = local_cd8[10];
      uVar21 = local_cd8[0xb];
      uVar22 = local_cd8[0xc];
      uVar23 = local_cd8[0xd];
      uVar24 = local_cd8[0xe];
      uVar25 = local_cd8[0xf];
      uVar26 = local_cd8[0x10];
      uVar27 = local_cd8[0x11];
      uVar28 = local_cd8[0x12];
      uVar29 = local_cd8[0x13];
      uVar30 = local_cd8[0x14];
      uVar31 = local_cd8[0x15];
      uVar32 = local_cd8[0x16];
      uVar33 = local_cd8[0x17];
      uVar34 = local_cd8[0x18];
      uVar35 = local_cd8[0x19];
      uVar36 = local_cd8[0x1a];
      uVar37 = local_cd8[0x1b];
      uVar38 = local_cd8[0x1c];
      uVar39 = local_cd8[0x1d];
      uVar40 = local_cd8[0x1e];
      uVar41 = local_cd8[0x1f];
      auVar1 = *(undefined1 (*) [32])(local_cd8 + 0x20);
      local_d30 = pfVar49;
      for (local_ea4 = 0; local_ea4 < (int)lVar47; local_ea4 = local_ea4 + 1) {
        local_eb0 = (undefined8 *)(lVar50 + (long)iVar3 * (long)local_ea4 * lVar5);
        local_eb8 = (undefined8 *)(lVar50 + (long)iVar3 * (long)(local_ea4 + 1) * lVar5);
        local_ec0 = (undefined8 *)(lVar50 + (long)iVar3 * (long)(local_ea4 + 2) * lVar5);
        for (local_ec4 = 0; local_ec4 < iVar2; local_ec4 = local_ec4 + 1) {
          local_400 = (float)uVar10;
          fStack_3fc = (float)((ulong)uVar10 >> 0x20);
          fStack_3f8 = (float)uVar11;
          fStack_3f4 = (float)((ulong)uVar11 >> 0x20);
          fStack_3f0 = (float)uVar12;
          fStack_3ec = (float)((ulong)uVar12 >> 0x20);
          fStack_3e8 = (float)uVar13;
          fStack_3e4 = (float)((ulong)uVar13 >> 0x20);
          local_420 = (float)*local_eb0;
          fStack_41c = (float)((ulong)*local_eb0 >> 0x20);
          fStack_418 = (float)local_eb0[1];
          fStack_414 = (float)((ulong)local_eb0[1] >> 0x20);
          fStack_410 = (float)local_eb0[2];
          fStack_40c = (float)((ulong)local_eb0[2] >> 0x20);
          fStack_408 = (float)local_eb0[3];
          local_440 = (float)uVar14;
          fStack_43c = (float)((ulong)uVar14 >> 0x20);
          fStack_438 = (float)uVar15;
          fStack_434 = (float)((ulong)uVar15 >> 0x20);
          fStack_430 = (float)uVar16;
          fStack_42c = (float)((ulong)uVar16 >> 0x20);
          fStack_428 = (float)uVar17;
          fStack_424 = (float)((ulong)uVar17 >> 0x20);
          local_460 = (float)local_eb0[4];
          fStack_45c = (float)((ulong)local_eb0[4] >> 0x20);
          fStack_458 = (float)local_eb0[5];
          fStack_454 = (float)((ulong)local_eb0[5] >> 0x20);
          fStack_450 = (float)local_eb0[6];
          fStack_44c = (float)((ulong)local_eb0[6] >> 0x20);
          fStack_448 = (float)local_eb0[7];
          local_480 = (float)uVar18;
          fStack_47c = (float)((ulong)uVar18 >> 0x20);
          fStack_478 = (float)uVar19;
          fStack_474 = (float)((ulong)uVar19 >> 0x20);
          fStack_470 = (float)uVar20;
          fStack_46c = (float)((ulong)uVar20 >> 0x20);
          fStack_468 = (float)uVar21;
          fStack_464 = (float)((ulong)uVar21 >> 0x20);
          local_4a0 = (float)local_eb0[8];
          fStack_49c = (float)((ulong)local_eb0[8] >> 0x20);
          fStack_498 = (float)local_eb0[9];
          fStack_494 = (float)((ulong)local_eb0[9] >> 0x20);
          fStack_490 = (float)local_eb0[10];
          fStack_48c = (float)((ulong)local_eb0[10] >> 0x20);
          fStack_488 = (float)local_eb0[0xb];
          local_7c0 = (float)uVar22;
          fStack_7bc = (float)((ulong)uVar22 >> 0x20);
          fStack_7b8 = (float)uVar23;
          fStack_7b4 = (float)((ulong)uVar23 >> 0x20);
          fStack_7b0 = (float)uVar24;
          fStack_7ac = (float)((ulong)uVar24 >> 0x20);
          fStack_7a8 = (float)uVar25;
          fStack_7a4 = (float)((ulong)uVar25 >> 0x20);
          local_620 = (float)*local_eb8;
          fStack_61c = (float)((ulong)*local_eb8 >> 0x20);
          fStack_618 = (float)local_eb8[1];
          fStack_614 = (float)((ulong)local_eb8[1] >> 0x20);
          fStack_610 = (float)local_eb8[2];
          fStack_60c = (float)((ulong)local_eb8[2] >> 0x20);
          fStack_608 = (float)local_eb8[3];
          local_820 = (float)uVar26;
          fStack_81c = (float)((ulong)uVar26 >> 0x20);
          fStack_818 = (float)uVar27;
          fStack_814 = (float)((ulong)uVar27 >> 0x20);
          fStack_810 = (float)uVar28;
          fStack_80c = (float)((ulong)uVar28 >> 0x20);
          fStack_808 = (float)uVar29;
          fStack_804 = (float)((ulong)uVar29 >> 0x20);
          local_5e0 = (float)local_eb8[4];
          fStack_5dc = (float)((ulong)local_eb8[4] >> 0x20);
          fStack_5d8 = (float)local_eb8[5];
          fStack_5d4 = (float)((ulong)local_eb8[5] >> 0x20);
          fStack_5d0 = (float)local_eb8[6];
          fStack_5cc = (float)((ulong)local_eb8[6] >> 0x20);
          fStack_5c8 = (float)local_eb8[7];
          local_880 = (float)uVar30;
          fStack_87c = (float)((ulong)uVar30 >> 0x20);
          fStack_878 = (float)uVar31;
          fStack_874 = (float)((ulong)uVar31 >> 0x20);
          fStack_870 = (float)uVar32;
          fStack_86c = (float)((ulong)uVar32 >> 0x20);
          fStack_868 = (float)uVar33;
          fStack_864 = (float)((ulong)uVar33 >> 0x20);
          local_5a0 = (float)local_eb8[8];
          fStack_59c = (float)((ulong)local_eb8[8] >> 0x20);
          fStack_598 = (float)local_eb8[9];
          fStack_594 = (float)((ulong)local_eb8[9] >> 0x20);
          fStack_590 = (float)local_eb8[10];
          fStack_58c = (float)((ulong)local_eb8[10] >> 0x20);
          fStack_588 = (float)local_eb8[0xb];
          local_8e0 = (float)uVar34;
          fStack_8dc = (float)((ulong)uVar34 >> 0x20);
          fStack_8d8 = (float)uVar35;
          fStack_8d4 = (float)((ulong)uVar35 >> 0x20);
          fStack_8d0 = (float)uVar36;
          fStack_8cc = (float)((ulong)uVar36 >> 0x20);
          fStack_8c8 = (float)uVar37;
          fStack_8c4 = (float)((ulong)uVar37 >> 0x20);
          local_560 = (float)*local_ec0;
          fStack_55c = (float)((ulong)*local_ec0 >> 0x20);
          fStack_558 = (float)local_ec0[1];
          fStack_554 = (float)((ulong)local_ec0[1] >> 0x20);
          fStack_550 = (float)local_ec0[2];
          fStack_54c = (float)((ulong)local_ec0[2] >> 0x20);
          fStack_548 = (float)local_ec0[3];
          local_940 = (float)uVar38;
          fStack_93c = (float)((ulong)uVar38 >> 0x20);
          fStack_938 = (float)uVar39;
          fStack_934 = (float)((ulong)uVar39 >> 0x20);
          fStack_930 = (float)uVar40;
          fStack_92c = (float)((ulong)uVar40 >> 0x20);
          fStack_928 = (float)uVar41;
          fStack_924 = (float)((ulong)uVar41 >> 0x20);
          local_520 = (float)local_ec0[4];
          fStack_51c = (float)((ulong)local_ec0[4] >> 0x20);
          fStack_518 = (float)local_ec0[5];
          fStack_514 = (float)((ulong)local_ec0[5] >> 0x20);
          fStack_510 = (float)local_ec0[6];
          fStack_50c = (float)((ulong)local_ec0[6] >> 0x20);
          fStack_508 = (float)local_ec0[7];
          local_9a0 = auVar1._0_4_;
          fStack_99c = auVar1._4_4_;
          fStack_998 = auVar1._8_4_;
          fStack_994 = auVar1._12_4_;
          fStack_990 = auVar1._16_4_;
          fStack_98c = auVar1._20_4_;
          fStack_988 = auVar1._24_4_;
          fStack_984 = auVar1._28_4_;
          local_4e0 = (float)local_ec0[8];
          fStack_4dc = (float)((ulong)local_ec0[8] >> 0x20);
          fStack_4d8 = (float)local_ec0[9];
          fStack_4d4 = (float)((ulong)local_ec0[9] >> 0x20);
          fStack_4d0 = (float)local_ec0[10];
          fStack_4cc = (float)((ulong)local_ec0[10] >> 0x20);
          fStack_4c8 = (float)local_ec0[0xb];
          auVar8 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x30);
          uStack_2f0 = auVar9._0_8_;
          uStack_2e8 = auVar9._8_8_;
          auVar45._4_4_ =
               fStack_8dc * fStack_55c + fStack_7bc * fStack_61c + fStack_3fc * fStack_41c;
          auVar45._0_4_ = local_8e0 * local_560 + local_7c0 * local_620 + local_400 * local_420;
          auVar45._8_4_ =
               fStack_8d8 * fStack_558 + fStack_7b8 * fStack_618 + fStack_3f8 * fStack_418;
          auVar45._12_4_ =
               fStack_8d4 * fStack_554 + fStack_7b4 * fStack_614 + fStack_3f4 * fStack_414;
          auVar45._16_4_ =
               fStack_8d0 * fStack_550 + fStack_7b0 * fStack_610 + fStack_3f0 * fStack_410;
          auVar45._20_4_ =
               fStack_8cc * fStack_54c + fStack_7ac * fStack_60c + fStack_3ec * fStack_40c;
          auVar45._24_4_ =
               fStack_8c8 * fStack_548 + fStack_7a8 * fStack_608 + fStack_3e8 * fStack_408;
          auVar45._28_4_ = fStack_8c4 + fStack_7a4 + fStack_3e4;
          auVar6._4_4_ = fStack_93c * fStack_51c + fStack_81c * fStack_5dc + fStack_43c * fStack_45c
          ;
          auVar6._0_4_ = local_940 * local_520 + local_820 * local_5e0 + local_440 * local_460;
          auVar6._8_4_ = fStack_938 * fStack_518 + fStack_818 * fStack_5d8 + fStack_438 * fStack_458
          ;
          auVar6._12_4_ =
               fStack_934 * fStack_514 + fStack_814 * fStack_5d4 + fStack_434 * fStack_454;
          auVar6._16_4_ =
               fStack_930 * fStack_510 + fStack_810 * fStack_5d0 + fStack_430 * fStack_450;
          auVar6._20_4_ =
               fStack_92c * fStack_50c + fStack_80c * fStack_5cc + fStack_42c * fStack_44c;
          auVar6._24_4_ =
               fStack_928 * fStack_508 + fStack_808 * fStack_5c8 + fStack_428 * fStack_448;
          auVar6._28_4_ = fStack_924 + fStack_804 + fStack_424;
          auVar6 = vhaddps_avx(auVar45,auVar6);
          auVar44._4_4_ =
               fStack_99c * fStack_4dc + fStack_87c * fStack_59c + fStack_47c * fStack_49c;
          auVar44._0_4_ = local_9a0 * local_4e0 + local_880 * local_5a0 + local_480 * local_4a0;
          auVar44._8_4_ =
               fStack_998 * fStack_4d8 + fStack_878 * fStack_598 + fStack_478 * fStack_498;
          auVar44._12_4_ =
               fStack_994 * fStack_4d4 + fStack_874 * fStack_594 + fStack_474 * fStack_494;
          auVar44._16_4_ =
               fStack_990 * fStack_4d0 + fStack_870 * fStack_590 + fStack_470 * fStack_490;
          auVar44._20_4_ =
               fStack_98c * fStack_4cc + fStack_86c * fStack_58c + fStack_46c * fStack_48c;
          auVar44._24_4_ =
               fStack_988 * fStack_4c8 + fStack_868 * fStack_588 + fStack_468 * fStack_488;
          auVar44._28_4_ = fStack_984 + fStack_864 + fStack_464;
          auVar7._16_8_ = uStack_2f0;
          auVar7._0_16_ = auVar8;
          auVar7._24_8_ = uStack_2e8;
          auVar7 = vhaddps_avx(auVar44,auVar7);
          auVar6 = vhaddps_avx(auVar6,auVar7);
          local_2b0 = auVar6._16_4_;
          fStack_2ac = auVar6._20_4_;
          fStack_2a8 = auVar6._24_4_;
          fStack_2a4 = auVar6._28_4_;
          local_2c0 = auVar6._0_4_;
          fStack_2bc = auVar6._4_4_;
          fStack_2b8 = auVar6._8_4_;
          fStack_2b4 = auVar6._12_4_;
          uVar42 = CONCAT44(fStack_2ac + fStack_2bc,local_2b0 + local_2c0);
          uVar43 = CONCAT44(fStack_2a4 + fStack_2b4,fStack_2a8 + fStack_2b8);
          auVar9._8_8_ = uVar43;
          auVar9._0_8_ = uVar42;
          auVar8._8_8_ = uVar43;
          auVar8._0_8_ = uVar42;
          auVar8 = vunpckhpd_avx(auVar8,auVar9);
          local_230 = auVar8._0_4_;
          fStack_22c = auVar8._4_4_;
          *local_d30 = local_2b0 + local_2c0 + local_230 + fStack_2ac + fStack_2bc + fStack_22c +
                       *local_d30;
          local_d30 = local_d30 + 1;
          local_eb0 = local_eb0 + 4;
          local_eb8 = local_eb8 + 4;
          local_ec0 = local_ec0 + 4;
        }
      }
      local_cd8 = local_cd8 + 0x24;
    }
  }
  return;
}

Assistant:

static void conv3x3s1_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);
                int j = 0;
                for (; j < outw; j++)
                {
                    __m256 _r00 = _mm256_loadu_ps(r0);
                    __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                    __m256 _r02 = _mm256_loadu_ps(r0 + 16);

                    __m256 _sum0 = _mm256_mul_ps(_k00, _r00);
                    __m256 _sum1 = _mm256_mul_ps(_k01, _r01);
                    __m256 _sum2 = _mm256_mul_ps(_k02, _r02);

                    __m256 _r10 = _mm256_loadu_ps(r1);
                    __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                    __m256 _r12 = _mm256_loadu_ps(r1 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k12, _r12, _sum2);

                    __m256 _r20 = _mm256_loadu_ps(r2);
                    __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                    __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k22, _r22, _sum2);
                    __m128 _sum = HorizontalSums(_sum0, _sum1, _sum2);

                    *outptr0 += _mm_reduce_add_ps(_sum); // dot
                    outptr0++;
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                }
            }

            k0 += 9 * 8;
        }
    }
}